

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

GArray * g_array_prepend_vals(GArray *farray,gconstpointer data,guint len)

{
  GRealArray *array;
  guint len_local;
  gconstpointer data_local;
  GArray *farray_local;
  
  if (len != 0) {
    g_array_maybe_expand((GRealArray *)farray,len);
    memmove(farray->data + *(int *)&farray[1].data * len,farray->data,
            (ulong)(*(int *)&farray[1].data * farray->len));
    memcpy(farray->data,data,(ulong)(*(int *)&farray[1].data * len));
    farray->len = len + farray->len;
    if (((ulong)farray[1].data & 0x100000000) != 0) {
      memset(farray->data + *(int *)&farray[1].data * farray->len,0,(ulong)*(uint *)&farray[1].data)
      ;
    }
  }
  return farray;
}

Assistant:

GArray* g_array_prepend_vals (GArray *farray, gconstpointer  data, guint len)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);

    if (len == 0)
        return farray;

    g_array_maybe_expand (array, len);

    memmove (g_array_elt_pos (array, len), g_array_elt_pos (array, 0),
            g_array_elt_len (array, array->len));

    memcpy (g_array_elt_pos (array, 0), data, g_array_elt_len (array, len));

    array->len += len;

    g_array_zero_terminate (array);

    return farray;
}